

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cpp
# Opt level: O2

void __thiscall Board::Board(Board *this,int size)

{
  vector<std::vector<Cell,_std::allocator<Cell>_>,_std::allocator<std::vector<Cell,_std::allocator<Cell>_>_>_>
  *this_00;
  int j;
  int iVar1;
  ulong uVar2;
  undefined1 local_58 [8];
  pointer pCStack_50;
  pointer local_48;
  ulong local_38;
  
  this->size = size;
  this_00 = &this->table;
  (this->table).
  super__Vector_base<std::vector<Cell,_std::allocator<Cell>_>,_std::allocator<std::vector<Cell,_std::allocator<Cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->table).
  super__Vector_base<std::vector<Cell,_std::allocator<Cell>_>,_std::allocator<std::vector<Cell,_std::allocator<Cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->table).
           super__Vector_base<std::vector<Cell,_std::allocator<Cell>_>,_std::allocator<std::vector<Cell,_std::allocator<Cell>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->table).
           super__Vector_base<std::vector<Cell,_std::allocator<Cell>_>,_std::allocator<std::vector<Cell,_std::allocator<Cell>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  local_58 = (undefined1  [8])0x0;
  pCStack_50 = (pointer)0x0;
  local_48 = (pointer)0x0;
  std::
  vector<std::vector<Cell,_std::allocator<Cell>_>,_std::allocator<std::vector<Cell,_std::allocator<Cell>_>_>_>
  ::_M_move_assign(this_00,local_58);
  std::
  vector<std::vector<Cell,_std::allocator<Cell>_>,_std::allocator<std::vector<Cell,_std::allocator<Cell>_>_>_>
  ::~vector((vector<std::vector<Cell,_std::allocator<Cell>_>,_std::allocator<std::vector<Cell,_std::allocator<Cell>_>_>_>
             *)local_58);
  uVar2 = 0;
  local_38 = 0;
  if (0 < size) {
    local_38 = (ulong)(uint)size;
  }
  for (; uVar2 != local_38; uVar2 = uVar2 + 1) {
    local_58 = (undefined1  [8])0x0;
    pCStack_50 = (pointer)0x0;
    local_48 = (pointer)0x0;
    std::
    vector<std::vector<Cell,std::allocator<Cell>>,std::allocator<std::vector<Cell,std::allocator<Cell>>>>
    ::emplace_back<std::vector<Cell,std::allocator<Cell>>>
              ((vector<std::vector<Cell,std::allocator<Cell>>,std::allocator<std::vector<Cell,std::allocator<Cell>>>>
                *)this_00,(vector<Cell,_std::allocator<Cell>_> *)local_58);
    std::_Vector_base<Cell,_std::allocator<Cell>_>::~_Vector_base
              ((_Vector_base<Cell,_std::allocator<Cell>_> *)local_58);
    for (iVar1 = 0; size != iVar1; iVar1 = iVar1 + 1) {
      local_58 = (undefined1  [8])CONCAT44(iVar1,(int)uVar2);
      pCStack_50 = (pointer)((ulong)pCStack_50 & 0xffffffffffffff00);
      local_48 = (pointer)0x0;
      std::vector<Cell,_std::allocator<Cell>_>::emplace_back<Cell>
                ((this_00->
                 super__Vector_base<std::vector<Cell,_std::allocator<Cell>_>,_std::allocator<std::vector<Cell,_std::allocator<Cell>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + uVar2,(Cell *)local_58);
    }
  }
  return;
}

Assistant:

Board::Board(int size)
    :size(size), occupiedCells(0){

    table = vector< vector<Cell> >();

    for (int i=0; i<size; i++){
        table.push_back(vector<Cell>());
        for (int j=0; j<size; j++){
            table[i].push_back( Cell(i,j) );
        }
    }
}